

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

int __thiscall CUSERCommand::doWhat(CUSERCommand *this,CClient *pClient)

{
  iterator *piVar1;
  bool bVar2;
  ArrayIndex AVar3;
  int iVar4;
  Value *pVVar5;
  uint index;
  string name;
  Value value;
  Value user;
  string ret;
  string local_1b0;
  Value local_190;
  Value local_168;
  Reader local_140;
  
  if ((this->super_CCommand).m_Args._M_string_length != 0) {
    Json::Value::Value(&local_190,nullValue);
    Json::Reader::Reader(&local_140);
    CCommand::GetUserInfo_abi_cxx11_();
    bVar2 = Json::Reader::parse(&local_140,&CCommand::GetUserInfo[abi:cxx11]()::userInfo_abi_cxx11_,
                                &local_190,true);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Load user info error,now exit.",0x1e);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      exit(-1);
    }
    pVVar5 = Json::Value::operator[](&local_190,"user");
    Json::Value::Value(&local_168,pVVar5);
    index = 0;
    while( true ) {
      AVar3 = Json::Value::size(&local_168);
      if (AVar3 <= index) break;
      pVVar5 = Json::Value::operator[](&local_168,index);
      pVVar5 = Json::Value::operator[](pVVar5,"name");
      Json::Value::asString_abi_cxx11_(&local_1b0,pVVar5);
      if (local_1b0._M_string_length == (this->super_CCommand).m_Args._M_string_length) {
        if (local_1b0._M_string_length != 0) {
          iVar4 = bcmp(local_1b0._M_dataplus._M_p,(this->super_CCommand).m_Args._M_dataplus._M_p,
                       local_1b0._M_string_length);
          if (iVar4 != 0) goto LAB_0010690f;
        }
        CClient::SetClientName(pClient,&local_1b0);
      }
LAB_0010690f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      index = index + 1;
    }
    Json::Value::~Value(&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
      operator_delete(local_140.commentsBefore_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
      operator_delete(local_140.document_._M_dataplus._M_p);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              (&local_140.errors_);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
    Json::Value::~Value(&local_190);
  }
  piVar1 = (iterator *)
           ((long)&local_140.nodes_.c.
                   super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                   super__Deque_impl_data + 0x10);
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)piVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"331 Please specify the password.\r\n","");
  CClient::sendMsg(pClient,(string *)&local_140);
  CClient::SetClientState(pClient,USER);
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map);
  }
  return 1;
}

Assistant:

int CUSERCommand::doWhat(CClient *pClient) {
    if(!m_Args.empty()){
        Json::Value value;
        Json::Reader reader;
        if(reader.parse(CCommand::GetUserInfo(),value)){
            Json::Value user = value["user"];
            for(int i = 0;i < user.size();i++){
                string name = user[i]["name"].asString();
                if(name == m_Args){
                    pClient->SetClientName(name);
                }
            }
        }
        else{
            cout << "Load user info error,now exit." << endl;
            exit(-1);
        }
    }
    string ret = "331 Please specify the password.\r\n";
    pClient->sendMsg(ret);
    pClient->SetClientState(USER);
    return 1;
}